

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O1

string * __thiscall CEObserver::print_abi_cxx11_(string *__return_storage_ptr__,CEObserver *this)

{
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"Observer:\n",(allocator *)&bStack_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&bStack_d8);
  dVar1 = Longitude_Deg(this);
  std::__cxx11::to_string(&local_58,dVar1);
  std::operator+(&local_38,"   (Lon,Lat) = (",&local_58);
  std::operator+(&local_b8,&local_38,", ");
  dVar1 = Latitude_Deg(this);
  std::__cxx11::to_string(&local_78,dVar1);
  std::operator+(&local_98,&local_b8,&local_78);
  std::operator+(&bStack_d8,&local_98,") deg\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  dVar1 = Elevation_m(this);
  std::__cxx11::to_string(&local_b8,dVar1);
  std::operator+(&local_98,"   Elevation = ",&local_b8);
  std::operator+(&bStack_d8,&local_98," m\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  dVar1 = Temperature_C(this);
  std::__cxx11::to_string(&local_b8,dVar1);
  std::operator+(&local_98,"   Temp      = ",&local_b8);
  std::operator+(&bStack_d8,&local_98," C\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  dVar1 = Pressure_hPa(this);
  std::__cxx11::to_string(&local_b8,dVar1);
  std::operator+(&local_98,"   Pressure  = ",&local_b8);
  std::operator+(&bStack_d8,&local_98," hPa\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  dVar1 = RelativeHumidity(this);
  std::__cxx11::to_string(&local_b8,dVar1);
  std::operator+(&local_98,"   Humidity  = ",&local_b8);
  std::operator+(&bStack_d8,&local_98," %%\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  dVar1 = Wavelength_um(this);
  std::__cxx11::to_string(&local_b8,dVar1);
  std::operator+(&local_98,"   Wavelength= ",&local_b8);
  std::operator+(&bStack_d8,&local_98," um\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string CEObserver::print(void) const
{
    // Fill in the returned string with formatted strings
    std::string msg("Observer:\n");
    msg += "   (Lon,Lat) = (" + std::to_string(Longitude_Deg()) + ", "  + 
                                std::to_string(Latitude_Deg()) + ") deg\n";
    msg += "   Elevation = " + std::to_string(Elevation_m()) + " m\n";
    msg += "   Temp      = " + std::to_string(Temperature_C()) + " C\n";
    msg += "   Pressure  = " + std::to_string(Pressure_hPa()) + " hPa\n";
    msg += "   Humidity  = " + std::to_string(RelativeHumidity()) + " %%\n";
    msg += "   Wavelength= " + std::to_string(Wavelength_um()) + " um\n";
    return msg;
}